

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharBitvec::ToComplement<char16_t>
          (CharBitvec *this,ArenaAllocator *allocator,uint base,CharSet<char16_t> *result)

{
  code *pcVar1;
  bool bVar2;
  Char lc;
  Char hc;
  int iVar3;
  undefined4 *puVar4;
  int local_2c;
  int li;
  int hi;
  CharSet<char16_t> *result_local;
  uint base_local;
  ArenaAllocator *allocator_local;
  CharBitvec *this_local;
  
  local_2c = -1;
  do {
    iVar3 = NextClear(this,local_2c + 1);
    if (iVar3 < 0) {
      return;
    }
    local_2c = NextSet(this,iVar3 + 1);
    if (local_2c < 0) {
      local_2c = 0xff;
    }
    else {
      if (local_2c < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x91,"(hi > 0)","hi > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_2c = local_2c + -1;
    }
    lc = Chars<char16_t>::ITC(base + iVar3);
    hc = Chars<char16_t>::ITC(base + local_2c);
    CharSet<char16_t>::SetRange(result,allocator,lc,hc);
  } while( true );
}

Assistant:

void CharBitvec::ToComplement(ArenaAllocator* allocator, uint base, CharSet<C>& result) const
    {
        int hi = -1;
        while (true)
        {
            // Find the next range of clear bits in vector
            int li = NextClear(hi + 1);
            if (li < 0)
                return;
            hi = NextSet(li + 1);
            if (hi < 0)
                hi = Size - 1;
            else
            {
                Assert(hi > 0);
                hi--;
            }

            // Add range as characters
            result.SetRange(allocator, Chars<C>::ITC(base + li), Chars<C>::ITC(base + hi));
        }
    }